

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int source_set_distribution_mode(SOURCE_HANDLE source,char *distribution_mode_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  SOURCE_INSTANCE *source_instance;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar2 = 0x32a6;
  }
  else {
    item_value = amqpvalue_create_symbol(distribution_mode_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x32ae;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(source->composite_value,6,item_value);
      iVar2 = 0x32b4;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int source_set_distribution_mode(SOURCE_HANDLE source, const char* distribution_mode_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE distribution_mode_amqp_value = amqpvalue_create_symbol(distribution_mode_value);
        if (distribution_mode_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 6, distribution_mode_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(distribution_mode_amqp_value);
        }
    }

    return result;
}